

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qpdfjob-c.cc
# Opt level: O0

int qpdfjob_run_from_json(char *json)

{
  int iVar1;
  anon_class_8_1_898d99e6 local_38;
  function<int_(_qpdfjob_handle_*)> local_30;
  char *local_10;
  char *json_local;
  
  local_38.json = json;
  local_10 = json;
  std::function<int(_qpdfjob_handle*)>::function<qpdfjob_run_from_json::__0,void>
            ((function<int(_qpdfjob_handle*)> *)&local_30,&local_38);
  iVar1 = run_with_handle(&local_30);
  std::function<int_(_qpdfjob_handle_*)>::~function(&local_30);
  return iVar1;
}

Assistant:

int
qpdfjob_run_from_json(char const* json)
{
    return run_with_handle(
        [json](qpdfjob_handle j) { return qpdfjob_initialize_from_json(j, json); });
}